

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_hashtable.cpp
# Opt level: O2

void __thiscall duckdb::JoinHashTable::InitializePartitionMasks(JoinHashTable *this)

{
  idx_t count;
  
  count = 1L << ((byte)this->radix_bits & 0x3f);
  TemplatedValidityMask<unsigned_long>::Initialize
            (&(this->current_partitions).super_TemplatedValidityMask<unsigned_long>,count);
  TemplatedValidityMask<unsigned_long>::SetAllInvalid
            (&(this->current_partitions).super_TemplatedValidityMask<unsigned_long>,count);
  TemplatedValidityMask<unsigned_long>::Initialize
            (&(this->completed_partitions).super_TemplatedValidityMask<unsigned_long>,count);
  TemplatedValidityMask<unsigned_long>::SetAllInvalid
            (&(this->completed_partitions).super_TemplatedValidityMask<unsigned_long>,count);
  return;
}

Assistant:

void JoinHashTable::InitializePartitionMasks() {
	const auto num_partitions = RadixPartitioning::NumberOfPartitions(radix_bits);

	current_partitions.Initialize(num_partitions);
	current_partitions.SetAllInvalid(num_partitions);

	completed_partitions.Initialize(num_partitions);
	completed_partitions.SetAllInvalid(num_partitions);
}